

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O2

string * toml::format_error<>
                   (string *__return_storage_ptr__,string *title,source_location *loc,string *msg)

{
  allocator<char> local_159;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  error_info local_f8;
  source_location local_a0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  std::__cxx11::string::string
            (&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)title);
  source_location::source_location(&local_a0,loc);
  std::__cxx11::string::string
            (&local_138,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  make_error_info<>(&local_f8,(string *)&local_118,&local_a0,(string *)&local_138);
  format_error(__return_storage_ptr__,&local_158,&local_f8);
  error_info::~error_info(&local_f8);
  std::__cxx11::string::~string((string *)&local_138);
  source_location::~source_location(&local_a0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string format_error(std::string title,
        source_location loc, std::string msg, Ts&& ... tail)
{
    return format_error("", make_error_info(std::move(title),
                std::move(loc), std::move(msg), std::forward<Ts>(tail)...));
}